

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureMS5637.cpp
# Opt level: O1

void __thiscall RTPressureMS5637::setTestData(RTPressureMS5637 *this)

{
  this->m_calData[0] = 0xb524;
  this->m_calData[1] = 0xabcd;
  this->m_calData[2] = 0x7183;
  this->m_calData[3] = 0x6cc2;
  this->m_calData[4] = 0x7b41;
  this->m_calData[5] = 0x6e05;
  this->m_D1 = 0x62a7a4;
  this->m_D2 = 0x7b4144;
  return;
}

Assistant:

void RTPressureMS5637::setTestData()
{
    m_calData[0] = 46372;
    m_calData[1] = 43981;
    m_calData[2] = 29059;
    m_calData[3] = 27842;
    m_calData[4] = 31553;
    m_calData[5] = 28165;

    m_D1 = 6465444;
    m_D2 = 8077636;
}